

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax*>::
emplace_back<slang::syntax::LocalVariableDeclarationSyntax*>
          (SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax*> *this,
          LocalVariableDeclarationSyntax **args)

{
  long lVar1;
  reference ppLVar2;
  pointer ppLVar3;
  
  lVar1 = *(long *)(this + 8);
  ppLVar3 = (pointer)(lVar1 * 8 + *(long *)this);
  if (lVar1 == *(long *)(this + 0x10)) {
    ppLVar3 = emplaceRealloc<slang::syntax::LocalVariableDeclarationSyntax*>(this,ppLVar3,args);
    return ppLVar3;
  }
  *ppLVar3 = *args;
  *(long *)(this + 8) = lVar1 + 1;
  ppLVar2 = SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*>::back
                      ((SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*> *)this);
  return ppLVar2;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }